

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reaction.cpp
# Opt level: O0

void __thiscall BindPolymerase::Execute(BindPolymerase *this)

{
  element_type *peVar1;
  SpeciesTracker *pSVar2;
  MobileElement *this_00;
  string *species_name;
  undefined1 local_70 [64];
  undefined1 local_30 [8];
  shared_ptr<Polymerase> new_pol;
  Ptr polymer;
  BindPolymerase *this_local;
  
  Bind::ChoosePolymer((Bind *)&new_pol.super___shared_ptr<Polymerase,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
  std::make_shared<Polymerase,Polymerase_const&>((Polymerase *)local_30);
  peVar1 = std::__shared_ptr_access<Polymer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Polymer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &new_pol.super___shared_ptr<Polymerase,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
  std::shared_ptr<MobileElement>::shared_ptr<Polymerase,void>
            ((shared_ptr<MobileElement> *)(local_70 + 0x20),(shared_ptr<Polymerase> *)local_30);
  (*peVar1->_vptr_Polymer[1])
            (peVar1,(shared_ptr<MobileElement> *)(local_70 + 0x20),
             &(this->super_Bind).promoter_name_);
  std::shared_ptr<MobileElement>::~shared_ptr((shared_ptr<MobileElement> *)(local_70 + 0x20));
  pSVar2 = SpeciesTracker::Instance();
  std::__shared_ptr_access<Polymer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Polymer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &new_pol.super___shared_ptr<Polymerase,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Polymer::wrapper((Polymer *)local_70);
  std::shared_ptr<Reaction>::shared_ptr<PolymerWrapper,void>
            ((shared_ptr<Reaction> *)(local_70 + 0x10),(shared_ptr<PolymerWrapper> *)local_70);
  Signal<std::shared_ptr<Reaction>_>::Emit
            (&pSVar2->propensity_signal_,(shared_ptr<Reaction> *)(local_70 + 0x10));
  std::shared_ptr<Reaction>::~shared_ptr((shared_ptr<Reaction> *)(local_70 + 0x10));
  std::shared_ptr<PolymerWrapper>::~shared_ptr((shared_ptr<PolymerWrapper> *)local_70);
  pSVar2 = SpeciesTracker::Instance();
  this_00 = &std::__shared_ptr_access<Polymerase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Polymerase,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )local_30)->super_MobileElement;
  species_name = MobileElement::name_abi_cxx11_(this_00);
  SpeciesTracker::Increment(pSVar2,species_name,-1);
  std::shared_ptr<Polymerase>::~shared_ptr((shared_ptr<Polymerase> *)local_30);
  std::shared_ptr<Polymer>::~shared_ptr
            ((shared_ptr<Polymer> *)
             &new_pol.super___shared_ptr<Polymerase,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void BindPolymerase::Execute() {
  auto polymer = ChoosePolymer();
  auto new_pol = std::make_shared<Polymerase>(pol_template_);
  polymer->Bind(new_pol, promoter_name_);
  SpeciesTracker::Instance().propensity_signal_.Emit(polymer->wrapper());
  // Polymer should handle decrementing promoter
  SpeciesTracker::Instance().Increment(new_pol->name(), -1);
}